

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::AddVariables
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,NLHeader *h)

{
  Error *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
  iVar4 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs;
  if (iVar4 < iVar3) {
    iVar4 = iVar3;
  }
  if (iVar4 != 0) {
    iVar5 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both -
            (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both;
    BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar5,CONTINUOUS);
    iVar3 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both;
    BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar3,INTEGER);
    iVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons -
            ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both +
            (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons);
    BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar1,CONTINUOUS);
    iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons;
    BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar2,INTEGER);
    iVar2 = iVar1 + iVar5 + iVar3 + iVar2;
    iVar3 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs;
    iVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
    iVar5 = iVar3 - iVar1;
    if (iVar5 != 0 && iVar1 <= iVar3) {
      iVar5 = iVar5 - (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs;
      BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar5,CONTINUOUS);
      iVar3 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs;
      BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar3,INTEGER);
      iVar2 = iVar2 + iVar5 + iVar3;
    }
    if (iVar4 != iVar2) {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(this_00,(CStringRef)0x172401,-1);
      goto LAB_0012df20;
    }
  }
  iVar3 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_vars -
          ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars + iVar4 +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars);
  BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar3,CONTINUOUS);
  iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars;
  BasicProblem<mp::BasicProblemParams<int>_>::AddVars(this->builder_,iVar2,INTEGER);
  if ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_vars == iVar2 + iVar4 + iVar3) {
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error(this_00,(CStringRef)0x172428,-1);
LAB_0012df20:
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void AddVariables(const NLHeader& h) {
    // Distinguish NL variable order
    // See D.M.Gay, Hooking Your Solver to AMPL;
    //     D.M.Gay, Writing .NL Files;
    // and, e.g.,
    // github.com/jump-dev/MathOptInterface.jl/blob/master/src/FileFormats/NL/README.md
    int k=0;                             // current block position
    const int num_nl_vars = std::max(h.num_nl_vars_in_cons,
                                     h.num_nl_vars_in_objs);
    if (num_nl_vars) {
      DoAddVars(h.num_nl_vars_in_both - h.num_nl_integer_vars_in_both,
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_both,
              var::INTEGER, k);
      DoAddVars(h.num_nl_vars_in_cons -
              (h.num_nl_vars_in_both + h.num_nl_integer_vars_in_cons),
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_cons,
              var::INTEGER, k);
      int num_nl_vars_in_objs_only =
          std::max(0, h.num_nl_vars_in_objs - h.num_nl_vars_in_cons);
      if (num_nl_vars_in_objs_only) {
        DoAddVars(num_nl_vars_in_objs_only - h.num_nl_integer_vars_in_objs,
                var::CONTINUOUS, k);
        DoAddVars(h.num_nl_integer_vars_in_objs,
                var::INTEGER, k);
      }
    }
    MP_ASSERT_ALWAYS(num_nl_vars == k, "NLProblemBuilder: num_nl_vars mismatch");
    DoAddVars(h.num_vars -
            (num_nl_vars +
             h.num_linear_integer_vars + h.num_linear_binary_vars),
            var::CONTINUOUS, k);
    DoAddVars(h.num_linear_integer_vars + h.num_linear_binary_vars,
            var::INTEGER, k);
    MP_ASSERT_ALWAYS(h.num_vars == k, "NLProblemBuilder: num_vars mismatch");
  }